

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MismatchedTokenException.cpp
# Opt level: O0

string * __thiscall
antlr::MismatchedTokenException::tokenName_abi_cxx11_(MismatchedTokenException *this,int tokenType)

{
  int in_EDX;
  long in_RSI;
  string *in_RDI;
  char *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  allocator<char> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  string local_48 [12];
  int in_stack_ffffffffffffffc4;
  string *in_stack_ffffffffffffffc8;
  allocator<char> local_15 [21];
  
  if (in_EDX == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    std::allocator<char>::~allocator(local_15);
  }
  else if ((in_EDX < 0) || (*(int *)(in_RSI + 0xc0) <= in_EDX)) {
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &stack0xffffffffffffff97;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    antlr::operator+(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
    std::operator+(__lhs,in_stack_ffffffffffffff60);
    std::__cxx11::string::~string(local_48);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff96);
  }
  return in_RDI;
}

Assistant:

string MismatchedTokenException::tokenName(int tokenType) const
{
	if (tokenType == Token::INVALID_TYPE)
		return "<Set of tokens>";
	else if (tokenType < 0 || tokenType >= numTokens)
		return ANTLR_USE_NAMESPACE(std)string("<") + tokenType + ">";
	else
		return tokenNames[tokenType];
}